

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Command::Validate(Command *this,string *shortprefix,string *longprefix)

{
  Base *pBVar1;
  bool bVar2;
  uint uVar3;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_00;
  reference ppBVar4;
  ValidationError *this_01;
  string local_1f0;
  ostringstream local_1c0 [8];
  ostringstream problem;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  string *psStack_20;
  anon_class_1_0_00000001 onValidationError;
  string *longprefix_local;
  string *shortprefix_local;
  Command *this_local;
  
  psStack_20 = longprefix;
  uVar3 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((uVar3 & 1) != 0) {
    this_00 = Group::Children(&this->super_Group);
    __end2 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_00);
    child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                       *)&child), bVar2) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                ::operator*(&__end2);
      pBVar1 = *ppBVar4;
      uVar3 = (*pBVar1->_vptr_Base[6])();
      if (((uVar3 & 1) != 0) && (uVar3 = (*pBVar1->_vptr_Base[2])(), (uVar3 & 1) == 0)) {
        Validate::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&__range2 + 7));
      }
      (*pBVar1->_vptr_Base[3])(pBVar1,shortprefix,psStack_20);
      __gnu_cxx::
      __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
      ::operator++(&__end2);
    }
    if (this->subparser != (Subparser *)0x0) {
      (*(this->subparser->super_Group).super_Base._vptr_Base[3])
                (this->subparser,shortprefix,psStack_20);
      uVar3 = (*(this->subparser->super_Group).super_Base._vptr_Base[2])();
      if ((uVar3 & 1) == 0) {
        Validate::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&__range2 + 7));
      }
    }
    if (((this->selectedCommand == (Command *)0x0) && ((this->commandIsRequired & 1U) != 0)) &&
       ((bVar2 = Group::HasCommand(&this->super_Group), bVar2 ||
        ((this->subparserHasCommand & 1U) != 0)))) {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      std::operator<<((ostream *)local_1c0,"Command is required");
      this_01 = (ValidationError *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      ValidationError::ValidationError(this_01,&local_1f0);
      __cxa_throw(this_01,&ValidationError::typeinfo,ValidationError::~ValidationError);
    }
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortprefix, const std::string &longprefix) const override
            {
                if (!Matched())
                {
                    return;
                }

                auto onValidationError = [&]
                {
                    std::ostringstream problem;
                    problem << "Group validation failed somewhere!";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                };

                for (Base *child: Children())
                {
                    if (child->IsGroup() && !child->Matched())
                    {
                        onValidationError();
                    }

                    child->Validate(shortprefix, longprefix);
                }

                if (subparser != nullptr)
                {
                    subparser->Validate(shortprefix, longprefix);
                    if (!subparser->Matched())
                    {
                        onValidationError();
                    }
                }

                if (selectedCommand == nullptr && commandIsRequired && (Group::HasCommand() || subparserHasCommand))
                {
                    std::ostringstream problem;
                    problem << "Command is required";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                }
            }